

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_program.c
# Opt level: O0

int archive_compressor_program_free(archive_write_filter *f)

{
  void *__ptr;
  long in_RDI;
  private_data_conflict5 *data;
  
  __ptr = *(void **)(in_RDI + 0x40);
  if (__ptr != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x20));
    archive_string_free((archive_string *)0x16c55b);
    __archive_write_program_free((archive_write_program_data *)0x16c568);
    free(__ptr);
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int
archive_compressor_program_free(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

	if (data) {
		free(data->cmd);
		archive_string_free(&data->description);
		__archive_write_program_free(data->pdata);
		free(data);
		f->data = NULL;
	}
	return (ARCHIVE_OK);
}